

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O2

void __thiscall
mnf::CartesianProduct::pseudoLog0_(CartesianProduct *this,RefVec *out,ConstRefVec *x)

{
  pointer psVar1;
  Manifold *this_00;
  long lVar2;
  ulong i;
  RefVec local_f8;
  ConstRefVec local_e0;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_b8 [24];
  DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_a0 [56];
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_68 [56];
  
  lVar2 = 0;
  for (i = 0; psVar1 = (this->subManifolds_).
                       super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
      i < (ulong)((long)(this->subManifolds_).
                        super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4); i = i + 1)
  {
    this_00 = *(Manifold **)
               ((long)&(psVar1->super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar2);
    local_f8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _0_8_ = *(undefined8 *)
             &out->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    local_f8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _8_8_ = *(undefined8 *)
             &(out->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).field_0x8;
    local_f8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _16_1_ = (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).field_0x10;
    Manifold::getView<1>((Segment *)local_68,&this->super_Manifold,&local_f8,i);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (local_b8,local_68,(type *)0x0);
    Manifold::getConstView<0>((ConstSegment *)local_a0,&this->super_Manifold,x,i);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_e0,
               local_a0,(type *)0x0);
    Manifold::pseudoLog0(this_00,(RefVec *)local_b8,&local_e0);
    free(local_e0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void CartesianProduct::pseudoLog0_(RefVec out, const ConstRefVec& x) const
{
  for (size_t i = 0; i < subManifolds_.size(); ++i)
  {
    subManifolds_[i]->pseudoLog0(getView<T>(out, i), getConstView<R>(x, i));
  }
}